

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

bool __thiscall Memory::Recycler::ForceSweepObject(Recycler *this)

{
  bool bVar1;
  undefined1 uVar2;
  
  bVar1 = BinaryFeatureControl::RecyclerTest();
  uVar2 = 1;
  if ((this->checkFn == (_func_BOOL_char_ptr_size_t *)0x0 || !bVar1) &&
     (this->trackerDictionary == (TypeInfotoTrackerItemMap *)0x0)) {
    bVar1 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Stats,RecyclerPhase);
    if (!bVar1) {
      uVar2 = this->enableScanImplicitRoots;
    }
  }
  return (bool)uVar2;
}

Assistant:

bool
Recycler::ForceSweepObject()
{
#ifdef RECYCLER_TEST_SUPPORT
    if (BinaryFeatureControl::RecyclerTest())
    {
        if (checkFn != nullptr)
        {
            return true;
        }
    }
#endif

#ifdef PROFILE_RECYCLER_ALLOC
    if (trackerDictionary != nullptr)
    {
        // Need to sweep object if we are tracing recycler allocs
        return true;
    }
#endif

#ifdef RECYCLER_STATS
    if (CUSTOM_PHASE_STATS1(this->GetRecyclerFlagsTable(), Js::RecyclerPhase))
    {
        return true;
    }
#endif

#if DBG
    // Force sweeping the object so we can assert that we are not sweeping objects that are still implicit roots
    if (this->enableScanImplicitRoots)
    {
        return true;
    }
#endif
    return false;
}